

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::GetBBox(ON_Viewport *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool local_109;
  undefined1 local_108 [7];
  bool rc;
  ON_3dPoint corners [9];
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_Viewport *this_local;
  
  local_109 = GetNearRect(this,(ON_3dPoint *)local_108,(ON_3dPoint *)&corners[0].z,
                          (ON_3dPoint *)&corners[1].z,(ON_3dPoint *)&corners[2].z);
  if (local_109) {
    local_109 = GetFarRect(this,(ON_3dPoint *)&corners[3].z,(ON_3dPoint *)&corners[4].z,
                           (ON_3dPoint *)&corners[5].z,(ON_3dPoint *)&corners[6].z);
  }
  corners[7].z = (this->m_CamLoc).x;
  corners[8].x = (this->m_CamLoc).y;
  corners[8].y = (this->m_CamLoc).z;
  if (local_109 != false) {
    local_109 = ON_GetPointListBoundingBox
                          (3,false,9,3,(double *)local_108,boxmin,boxmax,(uint)(-bGrowBox & 1));
  }
  return local_109;
}

Assistant:

bool ON_Viewport::GetBBox( 
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  ON_3dPoint corners[9];
  bool rc = GetNearRect(corners[0],corners[1],corners[2],corners[3]);
  if (rc)
    rc = GetFarRect(corners[4],corners[5],corners[6],corners[7]);
  corners[8] = m_CamLoc;
  if (rc)
  {
    rc = ON_GetPointListBoundingBox( 
            3, 0, 9, 
            3, &corners[0].x, 
            boxmin, boxmax,  bGrowBox?true:false
            );
  }
  return rc;
}